

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

raft_server * __thiscall nuraft::raft_server::get_current_params(raft_server *this)

{
  long lVar1;
  raft_server *prVar2;
  byte bVar3;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  bVar3 = 0;
  context::get_params((context *)&stack0xffffffffffffffe0);
  prVar2 = this;
  for (lVar1 = 0x1a; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined4 *)&prVar2->_vptr_raft_server = *(undefined4 *)local_20;
    local_20 = local_20 + (ulong)bVar3 * -8 + 4;
    prVar2 = (raft_server *)((long)prVar2 + (ulong)bVar3 * -8 + 4);
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  return this;
}

Assistant:

raft_params raft_server::get_current_params() const {
    return *ctx_->get_params();
}